

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosenbrock.cpp
# Opt level: O0

double rosenbrock(VectorXd *x)

{
  Index IVar1;
  ostream *this;
  Scalar *pSVar2;
  double dVar3;
  double dVar4;
  int local_24;
  VectorXd *pVStack_20;
  int i;
  double f;
  VectorXd *x_local;
  
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
  if (IVar1 < 2) {
    this = std::operator<<((ostream *)&std::cout,"dimension must be greater one");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    x_local = (VectorXd *)0x0;
  }
  else {
    pVStack_20 = (VectorXd *)0x0;
    local_24 = 0;
    while( true ) {
      IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
      if (IVar1 + -1 <= (long)local_24) break;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x,
                          (long)local_24,0);
      dVar3 = pow(*pSVar2,2.0);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x,
                          (long)(local_24 + 1),0);
      dVar3 = pow(dVar3 - *pSVar2,2.0);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x,
                          (long)local_24,0);
      dVar4 = pow(*pSVar2 - 1.0,2.0);
      pVStack_20 = (VectorXd *)(dVar3 * 100.0 + dVar4 + (double)pVStack_20);
      local_24 = local_24 + 1;
    }
    x_local = pVStack_20;
  }
  return (double)x_local;
}

Assistant:

double rosenbrock(Eigen::VectorXd x)
{
	if (x.size() < 2)
	{
		std::cout << "dimension must be greater one" << std::endl;
		return 0;
	}
	else
	{
		double f = 0;
		for (int i = 0; i < x.size() - 1; i++)
			f += 100 * (pow((pow((x(i, 0)), 2) - x(i + 1, 0)), 2)) + pow((x(i, 0) - 1), 2);
		return f;
	}
}